

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

RootBlock * __thiscall SQCompilation::SQParser::parse(SQParser *this)

{
  long lVar1;
  int iVar2;
  Block *this_00;
  Statement *stmt;
  
  this_00 = &newNode<SQCompilation::RootBlock,Arena*>(this,this->_astArena)->super_Block;
  iVar2 = _setjmp((__jmp_buf_tag *)this->_ctx->_errorjmp);
  if (iVar2 == 0) {
    Lex(this);
    *(int *)&this_00->field_0x8 = (int)(this->_lex)._tokenline;
    *(int *)&this_00->field_0xc = (int)(this->_lex)._tokencolumn;
    while (0 < this->_token) {
      stmt = parseStatement(this,false);
      Block::addStatement(this_00,stmt);
      lVar1 = (this->_lex)._prevtoken;
      if ((lVar1 != 0x3b) && (lVar1 != 0x7d)) {
        OptionalSemicolon(this);
      }
    }
    *(int *)&this_00->field_0x10 = (int)(this->_lex)._currentline;
    *(int *)&this_00->field_0x14 = (int)(this->_lex)._currentcolumn;
  }
  else {
    this_00 = (Block *)0x0;
  }
  return (RootBlock *)this_00;
}

Assistant:

RootBlock* SQParser::parse()
{
    RootBlock *rootBlock = newNode<RootBlock>(arena());

    if(setjmp(_ctx.errorJump()) == 0) {
        Lex();
        rootBlock->setLineStartPos(line());
        rootBlock->setColumnStartPos(column());
        while(_token > 0){
            rootBlock->addStatement(parseStatement());
            if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
        }
        rootBlock->setLineEndPos(_lex._currentline);
        rootBlock->setColumnEndPos(_lex._currentcolumn);
    }
    else {
        return NULL;
    }

    return rootBlock;
}